

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_transcode.cpp
# Opt level: O0

ktx_error_code_e
ktxTexture2_TranscodeBasis
          (ktxTexture2 *This,ktx_transcode_fmt_e outputFormat,ktx_transcode_flags transcodeFlags)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  ktx_bool_t kVar6;
  uint uVar7;
  uint uVar8;
  ktx_error_code_e kVar9;
  ktxTexture2 *This_00;
  ktxTexture2 **newTex;
  uint in_EDX;
  transcoder_texture_format in_ESI;
  long in_RDI;
  ktxTexture_protected *protoPrtctd;
  ktxTexture2_private *protoPriv;
  ktxTexture_protected *thisPrtctd;
  ktxTexture2 *prototype;
  ktx_error_code_e result;
  ktxTextureCreateInfo createInfo;
  basis_tex_format textureFormat;
  VkFormat vkFormat;
  uint32_t channelId_1;
  uint32_t channelId;
  alpha_content_e alphaContent;
  bool srgb;
  ktxTexture2_private *priv;
  khr_df_model_e colorModel;
  uint32_t *BDB;
  ktx_transcode_flags in_stack_000000e0;
  ktx_transcode_fmt_e in_stack_000000e4;
  ktxTexture2 *in_stack_000000e8;
  alpha_content_e in_stack_000000f4;
  ktxTexture2 *in_stack_000000f8;
  ktx_transcode_flags in_stack_00000460;
  ktx_transcode_fmt_e in_stack_00000464;
  ktxTexture2 *in_stack_00000468;
  alpha_content_e in_stack_00000474;
  ktxTexture2 *in_stack_00000478;
  ktx_uint8_t *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff60;
  ktxTextureCreateStorageEnum storageAllocation;
  ktxTextureCreateInfo *in_stack_ffffffffffffff68;
  long local_88;
  ktx_error_code_e local_7c;
  basis_tex_format local_48;
  undefined4 local_44;
  int local_38;
  transcoder_texture_format local_14;
  ktx_error_code_e local_4;
  
  storageAllocation = (ktxTextureCreateStorageEnum)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  lVar1 = *(long *)(in_RDI + 0x80);
  uVar7 = *(uint *)(lVar1 + 0xc) & 0xff;
  if ((uVar7 == 0xa6) || (*(int *)(in_RDI + 0x88) == 1)) {
    plVar2 = *(long **)(in_RDI + 0xa0);
    if ((*(int *)(in_RDI + 0x88) == 1) && ((*plVar2 == 0 || (plVar2[2] == 0)))) {
      local_4 = KTX_INVALID_OPERATION;
    }
    else if ((in_EDX & 2) == 0) {
      if (((in_ESI != cTFPVRTC1_4_RGB) && (in_ESI != cTFPVRTC1_4_RGBA)) ||
         ((bVar5 = isPow2(*(uint32_t *)(in_RDI + 0x24)), bVar5 &&
          (bVar5 = isPow2(*(uint32_t *)(in_RDI + 0x28)), bVar5)))) {
        bVar5 = (*(uint *)(lVar1 + 0xc) >> 0x10 & 0xff) == 2;
        local_38 = 0;
        if (uVar7 == 0xa3) {
          if ((*(uint *)(lVar1 + 8) >> 0x12) - 6 >> 2 == 2) {
            uVar8 = *(uint *)(lVar1 + 0x2c) >> 0x18 & 0xf;
            if (uVar8 == 0xf) {
              local_38 = 1;
            }
            else {
              if (uVar8 != 4) {
                return KTX_FILE_DATA_ERROR;
              }
              local_38 = 2;
            }
          }
        }
        else {
          uVar8 = *(uint *)(lVar1 + 0x1c) >> 0x18 & 0xf;
          if (uVar8 == 3) {
            local_38 = 1;
          }
          else if (uVar8 == 5) {
            local_38 = 2;
          }
        }
        newTex = (ktxTexture2 **)(ulong)(in_ESI - cTFPVRTC1_4_RGBA);
        switch(newTex) {
        case (ktxTexture2 **)0x0:
          local_14 = cTFPVRTC1_4_RGB;
          if (local_38 != 0) {
            local_14 = cTFPVRTC1_4_RGBA;
          }
          break;
        default:
          local_14 = in_ESI;
          break;
        case (ktxTexture2 **)0xa:
          local_14 = cTFPVRTC2_4_RGB;
          if (local_38 != 0) {
            local_14 = cTFPVRTC2_4_RGBA;
          }
          break;
        case (ktxTexture2 **)0xd:
          local_14 = (transcoder_texture_format)(local_38 != 0);
          break;
        case (ktxTexture2 **)0xe:
          local_14 = cTFBC1;
          if (local_38 != 0) {
            local_14 = cTFBC3;
          }
        }
        This_00 = (ktxTexture2 *)(ulong)local_14;
        switch(This_00) {
        case (ktxTexture2 *)0x0:
          local_44 = 0x93;
          if (bVar5) {
            local_44 = 0x94;
          }
          break;
        case (ktxTexture2 *)0x1:
          local_44 = 0x97;
          if (bVar5) {
            local_44 = 0x98;
          }
          break;
        case (ktxTexture2 *)0x2:
          local_44 = 0x83;
          if (bVar5) {
            local_44 = 0x84;
          }
          break;
        case (ktxTexture2 *)0x3:
          local_44 = 0x89;
          if (bVar5) {
            local_44 = 0x8a;
          }
          break;
        case (ktxTexture2 *)0x4:
          local_44 = 0x8b;
          break;
        case (ktxTexture2 *)0x5:
          local_44 = 0x8d;
          break;
        case (ktxTexture2 *)0x6:
          local_44 = 0x91;
          if (bVar5) {
            local_44 = 0x92;
          }
          break;
        default:
          return KTX_INVALID_VALUE;
        case (ktxTexture2 *)0x8:
        case (ktxTexture2 *)0x9:
          local_44 = 0x3b9b9cf1;
          if (bVar5) {
            local_44 = 0x3b9b9cf5;
          }
          break;
        case (ktxTexture2 *)0xa:
          local_44 = 0x9d;
          if (bVar5) {
            local_44 = 0x9e;
          }
          break;
        case (ktxTexture2 *)0xd:
          local_44 = 0x25;
          if (bVar5) {
            local_44 = 0x2b;
          }
          break;
        case (ktxTexture2 *)0xe:
          local_44 = 4;
          break;
        case (ktxTexture2 *)0xf:
          local_44 = 5;
          break;
        case (ktxTexture2 *)0x10:
          local_44 = 2;
          break;
        case (ktxTexture2 *)0x12:
        case (ktxTexture2 *)0x13:
          local_44 = 0x3b9b9cf3;
          if (bVar5) {
            local_44 = 0x3b9b9cf7;
          }
          break;
        case (ktxTexture2 *)0x14:
          local_44 = 0x99;
          break;
        case (ktxTexture2 *)0x15:
          local_44 = 0x9b;
        }
        local_48 = (basis_tex_format)(uVar7 == 0xa6);
        bVar5 = basist::basis_is_format_supported(local_14,local_48);
        if (bVar5) {
          kVar9 = ktxTexture2_Create(in_stack_ffffffffffffff68,storageAllocation,newTex);
          if (kVar9 == KTX_SUCCESS) {
            if (*(long *)(in_RDI + 0x70) == 0) {
              kVar6 = ktxTexture_isActiveStream((ktxTexture *)This_00);
              if (!kVar6) {
                ktxTexture2_Destroy((ktxTexture2 *)0x192cc6);
                return KTX_INVALID_OPERATION;
              }
              kVar9 = ktxTexture2_LoadImageData(This_00,in_stack_ffffffffffffff48,0x192c95);
              if (kVar9 != KTX_SUCCESS) {
                ktxTexture2_Destroy((ktxTexture2 *)0x192caa);
                return kVar9;
              }
            }
            if ((ktxTexture2_TranscodeBasis::transcoderInitialized & 1U) == 0) {
              basist::basisu_transcoder_init();
              ktxTexture2_TranscodeBasis::transcoderInitialized = true;
            }
            if (local_48 == cETC1S) {
              local_7c = ktxTexture2_transcodeLzEtc1s
                                   (in_stack_00000478,in_stack_00000474,in_stack_00000468,
                                    in_stack_00000464,in_stack_00000460);
            }
            else {
              local_7c = ktxTexture2_transcodeUastc
                                   (in_stack_000000f8,in_stack_000000f4,in_stack_000000e8,
                                    in_stack_000000e4,in_stack_000000e0);
            }
            if (local_7c == KTX_SUCCESS) {
              lVar1 = *(long *)(in_RDI + 0x18);
              lVar3 = *(long *)(local_88 + 0xa0);
              lVar4 = *(long *)(local_88 + 0x18);
              *(undefined8 *)(lVar1 + 0x18) = *(undefined8 *)(lVar4 + 0x18);
              *(undefined8 *)(lVar1 + 0x20) = *(undefined8 *)(lVar4 + 0x20);
              *(undefined8 *)(lVar1 + 0x28) = *(undefined8 *)(lVar4 + 0x28);
              *(undefined8 *)(lVar1 + 0x30) = *(undefined8 *)(lVar4 + 0x30);
              *(undefined4 *)(in_RDI + 0x78) = local_44;
              *(byte *)(in_RDI + 0x22) = *(byte *)(local_88 + 0x22) & 1;
              *(undefined4 *)(in_RDI + 0x88) = 0;
              *(undefined4 *)(plVar2 + 1) = *(undefined4 *)(lVar3 + 8);
              memcpy(plVar2 + 4,(void *)(lVar3 + 0x20),(ulong)*(uint *)(in_RDI + 0x34) * 0x18);
              free(*(void **)(in_RDI + 0x80));
              *(undefined8 *)(in_RDI + 0x80) = *(undefined8 *)(local_88 + 0x80);
              *(undefined8 *)(local_88 + 0x80) = 0;
              free(*(void **)(in_RDI + 0x70));
              *(undefined8 *)(in_RDI + 0x70) = *(undefined8 *)(local_88 + 0x70);
              *(undefined8 *)(in_RDI + 0x68) = *(undefined8 *)(local_88 + 0x68);
              *(undefined8 *)(local_88 + 0x70) = 0;
              *(undefined8 *)(local_88 + 0x68) = 0;
              *(undefined8 *)(*(long *)(in_RDI + 0xa0) + 0x10) = 0;
              if (**(long **)(in_RDI + 0xa0) != 0) {
                free((void *)**(undefined8 **)(in_RDI + 0xa0));
                **(undefined8 **)(in_RDI + 0xa0) = 0;
              }
            }
            ktxTexture2_Destroy((ktxTexture2 *)0x192f1f);
            local_4 = local_7c;
          }
          else {
            if (kVar9 != KTX_OUT_OF_MEMORY) {
              __assert_fail("result == KTX_OUT_OF_MEMORY",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/basis_transcode.cpp"
                            ,0x139,
                            "ktx_error_code_e ktxTexture2_TranscodeBasis(ktxTexture2 *, ktx_transcode_fmt_e, ktx_transcode_flags)"
                           );
            }
            local_4 = KTX_OUT_OF_MEMORY;
          }
        }
        else {
          local_4 = KTX_UNSUPPORTED_FEATURE;
        }
      }
      else {
        basisu::debug_printf
                  ("ktxTexture_TranscodeBasis: PVRTC1 only supports power of 2 dimensions\n");
        local_4 = KTX_INVALID_OPERATION;
      }
    }
    else {
      basisu::debug_printf
                (
                "ktxTexture_TranscodeBasis: KTX_TF_PVRTC_DECODE_TO_NEXT_POW2 currently unsupported\n"
                );
      local_4 = KTX_UNSUPPORTED_FEATURE;
    }
  }
  else {
    local_4 = KTX_INVALID_OPERATION;
  }
  return local_4;
}

Assistant:

KTX_error_code
 ktxTexture2_TranscodeBasis(ktxTexture2* This,
                            ktx_transcode_fmt_e outputFormat,
                            ktx_transcode_flags transcodeFlags)
{
    uint32_t* BDB = This->pDfd + 1;
    khr_df_model_e colorModel = (khr_df_model_e)KHR_DFDVAL(BDB, MODEL);
    if (colorModel != KHR_DF_MODEL_UASTC
        // Constructor has checked color model matches BASIS_LZ.
        && This->supercompressionScheme != KTX_SS_BASIS_LZ)
    {
        return KTX_INVALID_OPERATION; // Not in a transcodable format.
    }

    DECLARE_PRIVATE(priv, This);
    if (This->supercompressionScheme == KTX_SS_BASIS_LZ) {
        if (!priv._supercompressionGlobalData || priv._sgdByteLength == 0)
            return KTX_INVALID_OPERATION;
    }

    if (transcodeFlags & KTX_TF_PVRTC_DECODE_TO_NEXT_POW2) {
         debug_printf("ktxTexture_TranscodeBasis: KTX_TF_PVRTC_DECODE_TO_NEXT_POW2 currently unsupported\n");
         return KTX_UNSUPPORTED_FEATURE;
    }

    if (outputFormat == KTX_TTF_PVRTC1_4_RGB
        || outputFormat == KTX_TTF_PVRTC1_4_RGBA) {
         if ((!isPow2(This->baseWidth)) || (!isPow2(This->baseHeight))) {
             debug_printf("ktxTexture_TranscodeBasis: PVRTC1 only supports power of 2 dimensions\n");
             return KTX_INVALID_OPERATION;
        }
    }

    const bool srgb = (KHR_DFDVAL(BDB, TRANSFER) == KHR_DF_TRANSFER_SRGB);
    alpha_content_e alphaContent = eNone;
    if (colorModel == KHR_DF_MODEL_ETC1S) {
        if (KHR_DFDSAMPLECOUNT(BDB) == 2) {
            uint32_t channelId = KHR_DFDSVAL(BDB, 1, CHANNELID);
            if (channelId == KHR_DF_CHANNEL_ETC1S_AAA) {
                alphaContent = eAlpha;
            } else if (channelId == KHR_DF_CHANNEL_ETC1S_GGG){
                alphaContent = eGreen;
            } else {
                return KTX_FILE_DATA_ERROR;
            }
        }
    } else {
        uint32_t channelId = KHR_DFDSVAL(BDB, 0, CHANNELID);
        if (channelId == KHR_DF_CHANNEL_UASTC_RGBA)
            alphaContent = eAlpha;
        else if (channelId == KHR_DF_CHANNEL_UASTC_RRRG)
            alphaContent = eGreen;
    }

    VkFormat vkFormat;

    // Do some format mapping.
    switch (outputFormat) {
      case KTX_TTF_BC1_OR_3:
        outputFormat = alphaContent != eNone ? KTX_TTF_BC3_RGBA
                                             : KTX_TTF_BC1_RGB;
        break;
      case KTX_TTF_ETC:
        outputFormat = alphaContent != eNone ? KTX_TTF_ETC2_RGBA
                                             : KTX_TTF_ETC1_RGB;
        break;
      case KTX_TTF_PVRTC1_4_RGBA:
        // This transcoder does not write opaque alpha blocks.
        outputFormat = alphaContent != eNone  ? KTX_TTF_PVRTC1_4_RGBA
                                              : KTX_TTF_PVRTC1_4_RGB;
        break;
      case KTX_TTF_PVRTC2_4_RGBA:
        // This transcoder does not write opaque alpha blocks.
        outputFormat = alphaContent != eNone ? KTX_TTF_PVRTC2_4_RGBA
                                              : KTX_TTF_PVRTC2_4_RGB;
        break;
      default:
        /*NOP*/;
    }

    switch (outputFormat) {
      case KTX_TTF_ETC1_RGB:
        vkFormat = srgb ? VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK
                        : VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK;
        break;
      case KTX_TTF_ETC2_RGBA:
        vkFormat = srgb ? VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK
                        : VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK;
        break;
      case KTX_TTF_ETC2_EAC_R11:
        vkFormat = VK_FORMAT_EAC_R11_UNORM_BLOCK;
        break;
      case KTX_TTF_ETC2_EAC_RG11:
        vkFormat = VK_FORMAT_EAC_R11G11_UNORM_BLOCK;
        break;
      case KTX_TTF_BC1_RGB:
        // Transcoding doesn't support BC1 alpha.
        vkFormat = srgb ? VK_FORMAT_BC1_RGB_SRGB_BLOCK
                        : VK_FORMAT_BC1_RGB_UNORM_BLOCK;
        break;
      case KTX_TTF_BC3_RGBA:
        vkFormat = srgb ? VK_FORMAT_BC3_SRGB_BLOCK
                        : VK_FORMAT_BC3_UNORM_BLOCK;
        break;
      case KTX_TTF_BC4_R:
        vkFormat = VK_FORMAT_BC4_UNORM_BLOCK;
        break;
      case KTX_TTF_BC5_RG:
        vkFormat = VK_FORMAT_BC5_UNORM_BLOCK;
        break;
      case KTX_TTF_PVRTC1_4_RGB:
      case KTX_TTF_PVRTC1_4_RGBA:
        vkFormat = srgb ? VK_FORMAT_PVRTC1_4BPP_SRGB_BLOCK_IMG
                        : VK_FORMAT_PVRTC1_4BPP_UNORM_BLOCK_IMG;
        break;
      case KTX_TTF_PVRTC2_4_RGB:
      case KTX_TTF_PVRTC2_4_RGBA:
        vkFormat = srgb ? VK_FORMAT_PVRTC2_4BPP_SRGB_BLOCK_IMG
                        : VK_FORMAT_PVRTC2_4BPP_UNORM_BLOCK_IMG;
        break;
      case KTX_TTF_BC7_RGBA:
        vkFormat = srgb ? VK_FORMAT_BC7_SRGB_BLOCK
                        : VK_FORMAT_BC7_UNORM_BLOCK;
        break;
      case KTX_TTF_ASTC_4x4_RGBA:
        vkFormat = srgb ? VK_FORMAT_ASTC_4x4_SRGB_BLOCK
                        : VK_FORMAT_ASTC_4x4_UNORM_BLOCK;
        break;
      case KTX_TTF_RGB565:
        vkFormat = VK_FORMAT_R5G6B5_UNORM_PACK16;
        break;
      case KTX_TTF_BGR565:
        vkFormat = VK_FORMAT_B5G6R5_UNORM_PACK16;
        break;
      case KTX_TTF_RGBA4444:
        vkFormat = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
        break;
      case KTX_TTF_RGBA32:
        vkFormat = srgb ? VK_FORMAT_R8G8B8A8_SRGB
                        : VK_FORMAT_R8G8B8A8_UNORM;
        break;
      default:
        return KTX_INVALID_VALUE;
    }

    basis_tex_format textureFormat;
    if (colorModel == KHR_DF_MODEL_UASTC)
        textureFormat = basis_tex_format::cUASTC4x4;
    else
        textureFormat = basis_tex_format::cETC1S;

    if (!basis_is_format_supported((transcoder_texture_format)outputFormat,
                                    textureFormat)) {
        return KTX_UNSUPPORTED_FEATURE;
    }


    // Create a prototype texture to use for calculating sizes in the target
    // format and, as useful side effects, provide us with a properly sized
    // data allocation and the DFD for the target format.
    ktxTextureCreateInfo createInfo;
    createInfo.glInternalformat = 0;
    createInfo.vkFormat = vkFormat;
    createInfo.baseWidth = This->baseWidth;
    createInfo.baseHeight = This->baseHeight;
    createInfo.baseDepth = This->baseDepth;
    createInfo.generateMipmaps = This->generateMipmaps;
    createInfo.isArray = This->isArray;
    createInfo.numDimensions = This->numDimensions;
    createInfo.numFaces = This->numFaces;
    createInfo.numLayers = This->numLayers;
    createInfo.numLevels = This->numLevels;
    createInfo.pDfd = nullptr;

    KTX_error_code result;
    ktxTexture2* prototype;
    result = ktxTexture2_Create(&createInfo, KTX_TEXTURE_CREATE_ALLOC_STORAGE,
                                &prototype);

    if (result != KTX_SUCCESS) {
        assert(result == KTX_OUT_OF_MEMORY); // The only run time error
        return result;
    }

    if (!This->pData) {
        if (ktxTexture_isActiveStream((ktxTexture*)This)) {
             // Load pending. Complete it.
            result = ktxTexture2_LoadImageData(This, NULL, 0);
            if (result != KTX_SUCCESS)
            {
                ktxTexture2_Destroy(prototype);
                return result;
            }
        } else {
            // No data to transcode.
            ktxTexture2_Destroy(prototype);
            return KTX_INVALID_OPERATION;
        }
    }

    // Transcoder global initialization. Requires ~9 milliseconds when compiled
    // and executed natively on a Core i7 2.2 GHz. If this is too slow, the
    // tables it computes can easily be moved to be compiled in.
    static bool transcoderInitialized;
    if (!transcoderInitialized) {
        basisu_transcoder_init();
        transcoderInitialized = true;
    }

    if (textureFormat == basis_tex_format::cETC1S) {
        result = ktxTexture2_transcodeLzEtc1s(This, alphaContent,
                                            prototype, outputFormat,
                                            transcodeFlags);
    } else {
        result = ktxTexture2_transcodeUastc(This, alphaContent,
                                            prototype, outputFormat,
                                            transcodeFlags);
    }

    if (result == KTX_SUCCESS) {
        // Fix up the current texture
        DECLARE_PROTECTED(thisPrtctd, This);
        DECLARE_PRIVATE(protoPriv, prototype);
        DECLARE_PROTECTED(protoPrtctd, prototype);
        memcpy(&thisPrtctd._formatSize, &protoPrtctd._formatSize,
               sizeof(ktxFormatSize));
        This->vkFormat = vkFormat;
        This->isCompressed = prototype->isCompressed;
        This->supercompressionScheme = KTX_SS_NONE;
        priv._requiredLevelAlignment = protoPriv._requiredLevelAlignment;
        // Copy the levelIndex from the prototype to This.
        memcpy(priv._levelIndex, protoPriv._levelIndex,
               This->numLevels * sizeof(ktxLevelIndexEntry));
        // Move the DFD and data from the prototype to This.
        free(This->pDfd);
        This->pDfd = prototype->pDfd;
        prototype->pDfd = 0;
        free(This->pData);
        This->pData = prototype->pData;
        This->dataSize = prototype->dataSize;
        prototype->pData = 0;
        prototype->dataSize = 0;
        // Free SGD data
        This->_private->_sgdByteLength = 0;
        if (This->_private->_supercompressionGlobalData) {
            free(This->_private->_supercompressionGlobalData);
            This->_private->_supercompressionGlobalData = NULL;
        }
    }
    ktxTexture2_Destroy(prototype);
    return result;
 }